

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgExecutionContext.cpp
# Opt level: O0

void rsg::assignMasked(ExecValueAccess dst,ExecConstValueAccess src,ExecConstValueAccess mask)

{
  ExecConstValueAccess mask_00;
  ExecConstValueAccess mask_01;
  bool bVar1;
  Type TVar2;
  int iVar3;
  Scalar SVar4;
  VariableType *this;
  vector<rsg::VariableType::Member,_std::allocator<rsg::VariableType::Member>_> *this_00;
  size_type sVar5;
  Scalar *pSVar6;
  StridedValueAccess<64> SVar7;
  ConstStridedValueAccess<64> CVar8;
  int local_dc;
  undefined1 auStack_d8 [4];
  int compNdx;
  ExecConstValueAccess srcElem;
  ExecValueAccess dstElem;
  int elemNdx_1;
  int local_80;
  int memberNdx;
  int numMembers;
  int local_48;
  int elemNdx;
  int numElems;
  VariableType *type;
  ExecConstValueAccess mask_local;
  ExecConstValueAccess src_local;
  ExecValueAccess dst_local;
  
  src_local.m_value = (Scalar *)dst.super_ConstStridedValueAccess<64>.m_type;
  src_local.m_type = (VariableType *)src.m_value;
  mask_local.m_value = (Scalar *)src.m_type;
  mask_local.m_type = (VariableType *)mask.m_value;
  type = mask.m_type;
  this = ConstStridedValueAccess<64>::getType((ConstStridedValueAccess<64> *)&src_local.m_value);
  TVar2 = VariableType::getBaseType(this);
  if (2 < TVar2 - TYPE_FLOAT) {
    if (TVar2 == TYPE_STRUCT) {
      this_00 = VariableType::getMembers(this);
      sVar5 = std::vector<rsg::VariableType::Member,_std::allocator<rsg::VariableType::Member>_>::
              size(this_00);
      for (local_80 = 0; local_80 < (int)sVar5; local_80 = local_80 + 1) {
        SVar7 = StridedValueAccess<64>::member
                          ((StridedValueAccess<64> *)&src_local.m_value,local_80);
        CVar8 = ConstStridedValueAccess<64>::member
                          ((ConstStridedValueAccess<64> *)&mask_local.m_value,local_80);
        mask_00.m_value = (Scalar *)mask_local.m_type;
        mask_00.m_type = type;
        assignMasked((ExecValueAccess)SVar7.super_ConstStridedValueAccess<64>,CVar8,mask_00);
      }
      return;
    }
    if (TVar2 == TYPE_ARRAY) {
      iVar3 = VariableType::getNumElements(this);
      for (local_48 = 0; local_48 < iVar3; local_48 = local_48 + 1) {
        SVar7 = StridedValueAccess<64>::arrayElement
                          ((StridedValueAccess<64> *)&src_local.m_value,local_48);
        CVar8 = ConstStridedValueAccess<64>::arrayElement
                          ((ConstStridedValueAccess<64> *)&mask_local.m_value,local_48);
        mask_01.m_value = (Scalar *)mask_local.m_type;
        mask_01.m_type = type;
        assignMasked((ExecValueAccess)SVar7.super_ConstStridedValueAccess<64>,CVar8,mask_01);
      }
      return;
    }
    if (1 < TVar2 - TYPE_SAMPLER_2D) {
      return;
    }
  }
  for (dstElem.super_ConstStridedValueAccess<64>.m_value._4_4_ = 0;
      iVar3 = VariableType::getNumElements(this),
      dstElem.super_ConstStridedValueAccess<64>.m_value._4_4_ < iVar3;
      dstElem.super_ConstStridedValueAccess<64>.m_value._4_4_ =
           dstElem.super_ConstStridedValueAccess<64>.m_value._4_4_ + 1) {
    join_0x00000010_0x00000000_ =
         (ConstStridedValueAccess<64>)
         StridedValueAccess<64>::component
                   ((StridedValueAccess<64> *)&src_local.m_value,
                    dstElem.super_ConstStridedValueAccess<64>.m_value._4_4_);
    _auStack_d8 = ConstStridedValueAccess<64>::component
                            ((ConstStridedValueAccess<64> *)&mask_local.m_value,
                             dstElem.super_ConstStridedValueAccess<64>.m_value._4_4_);
    for (local_dc = 0; local_dc < 0x40; local_dc = local_dc + 1) {
      bVar1 = ConstStridedValueAccess<64>::asBool((ConstStridedValueAccess<64> *)&type,local_dc);
      if (bVar1) {
        SVar4 = ConstStridedValueAccess<64>::asScalar
                          ((ConstStridedValueAccess<64> *)auStack_d8,local_dc);
        pSVar6 = StridedValueAccess<64>::asScalar
                           ((StridedValueAccess<64> *)&srcElem.m_value,local_dc);
        *pSVar6 = SVar4;
      }
    }
  }
  return;
}

Assistant:

void assignMasked (ExecValueAccess dst, ExecConstValueAccess src, ExecConstValueAccess mask)
{
	const VariableType& type = dst.getType();

	switch (type.getBaseType())
	{
		case VariableType::TYPE_ARRAY:
		{
			int numElems = type.getNumElements();
			for (int elemNdx = 0; elemNdx < numElems; elemNdx++)
				assignMasked(dst.arrayElement(elemNdx), src.arrayElement(elemNdx), mask);

			break;
		}

		case VariableType::TYPE_STRUCT:
		{
			int numMembers = (int)type.getMembers().size();
			for (int memberNdx = 0; memberNdx < numMembers; memberNdx++)
				assignMasked(dst.member(memberNdx), src.member(memberNdx), mask);

			break;
		}

		case VariableType::TYPE_FLOAT:
		case VariableType::TYPE_INT:
		case VariableType::TYPE_BOOL:
		case VariableType::TYPE_SAMPLER_2D:
		case VariableType::TYPE_SAMPLER_CUBE:
		{
			for (int elemNdx = 0; elemNdx < type.getNumElements(); elemNdx++)
			{
				ExecValueAccess			dstElem		= dst.component(elemNdx);
				ExecConstValueAccess	srcElem		= src.component(elemNdx);

				for (int compNdx = 0; compNdx < EXEC_VEC_WIDTH; compNdx++)
				{
					if (mask.asBool(compNdx))
						dstElem.asScalar(compNdx) = srcElem.asScalar(compNdx);
				}
			}

			break;
		}

		default:
			DE_FATAL("Unsupported");
			break;
	}
}